

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Shape.cpp
# Opt level: O1

void __thiscall Assimp::X3DImporter::ParseNode_Shape_Shape(X3DImporter *this)

{
  size_t *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  FIReader *pFVar3;
  char *pcVar4;
  CX3DImporter_NodeElement *pCVar5;
  list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_> *plVar6;
  bool bVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  undefined4 extraout_var;
  char *__s;
  undefined4 extraout_var_01;
  _List_node_base *p_Var11;
  string *psVar12;
  uint uVar13;
  ulong uVar14;
  char *__end;
  string an;
  CX3DImporter_NodeElement *ne;
  string def;
  string use;
  string local_a8;
  X3DImporter *local_88;
  allocator<char> local_79;
  CX3DImporter_NodeElement *local_78;
  string local_70;
  string local_50;
  undefined4 extraout_var_00;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_78 = (CX3DImporter_NodeElement *)0x0;
  uVar8 = (*(((this->mReader)._M_t.
              super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
              super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
              super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
            super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[4])();
  local_88 = this;
  if (0 < (int)uVar8) {
    uVar14 = 0;
    do {
      pFVar3 = (this->mReader)._M_t.
               super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
               super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
               super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
      iVar9 = (*(pFVar3->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[5])
                        (pFVar3,uVar14);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a8,(char *)CONCAT44(extraout_var,iVar9),&local_79);
      iVar9 = std::__cxx11::string::compare((char *)&local_a8);
      if (iVar9 == 0) {
        iVar9 = (*(((this->mReader)._M_t.
                    super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                    .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                  super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])();
        __s = (char *)CONCAT44(extraout_var_00,iVar9);
        psVar12 = &local_70;
LAB_0064d64e:
        pcVar4 = (char *)psVar12->_M_string_length;
        strlen(__s);
        std::__cxx11::string::_M_replace((ulong)psVar12,0,pcVar4,(ulong)__s);
        this = local_88;
      }
      else {
        iVar9 = std::__cxx11::string::compare((char *)&local_a8);
        if (iVar9 == 0) {
          iVar9 = (*(((this->mReader)._M_t.
                      super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                      .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                    super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])();
          __s = (char *)CONCAT44(extraout_var_01,iVar9);
          psVar12 = &local_50;
          goto LAB_0064d64e;
        }
        iVar9 = std::__cxx11::string::compare((char *)&local_a8);
        if (((iVar9 != 0) && (iVar9 = std::__cxx11::string::compare((char *)&local_a8), iVar9 != 0))
           && (iVar9 = std::__cxx11::string::compare((char *)&local_a8), iVar9 != 0)) {
          Throw_IncorrectAttr(this,&local_a8);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      uVar13 = (int)uVar14 + 1;
      uVar14 = (ulong)uVar13;
    } while (uVar8 != uVar13);
  }
  if (local_50._M_string_length == 0) {
    local_78 = (CX3DImporter_NodeElement *)operator_new(0x50);
    pCVar5 = this->NodeElement_Cur;
    local_78->Type = ENET_Shape;
    (local_78->ID)._M_dataplus._M_p = (pointer)&(local_78->ID).field_2;
    (local_78->ID)._M_string_length = 0;
    (local_78->ID).field_2._M_local_buf[0] = '\0';
    local_78->Parent = pCVar5;
    (local_78->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_78->Child;
    (local_78->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_78->Child;
    (local_78->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node._M_size = 0;
    local_78->_vptr_CX3DImporter_NodeElement = (_func_int **)&PTR__CX3DImporter_NodeElement_008f4830
    ;
    if (local_70._M_string_length != 0) {
      std::__cxx11::string::_M_assign((string *)&local_78->ID);
    }
    iVar9 = (*(((this->mReader)._M_t.
                super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t
                .super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
                super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
              super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xf])();
    if ((char)iVar9 == '\0') {
      ParseHelper_Node_Enter(this,local_78);
      paVar2 = &local_a8.field_2;
      do {
        do {
          while( true ) {
            iVar9 = (*(((this->mReader)._M_t.
                        super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                        .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                      super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[2])();
            if ((char)iVar9 == '\0') goto LAB_0064e23c;
            iVar10 = (*(((this->mReader)._M_t.
                         super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                         .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                       super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[3])();
            if (iVar10 != 1) break;
            local_a8._M_dataplus._M_p = (pointer)paVar2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"Appearance","");
            (*(((this->mReader)._M_t.
                super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t
                .super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
                super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
              super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xd])();
            iVar9 = std::__cxx11::string::compare((char *)&local_a8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p != paVar2) {
              operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
            }
            if (iVar9 == 0) {
              ParseNode_Shape_Appearance(this);
            }
            else {
              local_a8._M_dataplus._M_p = (pointer)paVar2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"Arc2D","");
              (*(((this->mReader)._M_t.
                  super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                  .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xd])();
              iVar9 = std::__cxx11::string::compare((char *)&local_a8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._M_dataplus._M_p != paVar2) {
                operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1
                               );
              }
              if (iVar9 == 0) {
                ParseNode_Geometry2D_Arc2D(this);
              }
              else {
                local_a8._M_dataplus._M_p = (pointer)paVar2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"ArcClose2D","")
                ;
                (*(((this->mReader)._M_t.
                    super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                    .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                  super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xd])();
                iVar9 = std::__cxx11::string::compare((char *)&local_a8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_a8._M_dataplus._M_p != paVar2) {
                  operator_delete(local_a8._M_dataplus._M_p,
                                  local_a8.field_2._M_allocated_capacity + 1);
                }
                if (iVar9 == 0) {
                  ParseNode_Geometry2D_ArcClose2D(this);
                }
                else {
                  local_a8._M_dataplus._M_p = (pointer)paVar2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"Circle2D","")
                  ;
                  (*(((this->mReader)._M_t.
                      super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                      .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                    super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xd])();
                  iVar9 = std::__cxx11::string::compare((char *)&local_a8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_a8._M_dataplus._M_p != paVar2) {
                    operator_delete(local_a8._M_dataplus._M_p,
                                    local_a8.field_2._M_allocated_capacity + 1);
                  }
                  if (iVar9 == 0) {
                    ParseNode_Geometry2D_Circle2D(this);
                  }
                  else {
                    local_a8._M_dataplus._M_p = (pointer)paVar2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"Disk2D","")
                    ;
                    (*(((this->mReader)._M_t.
                        super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                        .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                      super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xd])();
                    iVar9 = std::__cxx11::string::compare((char *)&local_a8);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_a8._M_dataplus._M_p != paVar2) {
                      operator_delete(local_a8._M_dataplus._M_p,
                                      local_a8.field_2._M_allocated_capacity + 1);
                    }
                    if (iVar9 == 0) {
                      ParseNode_Geometry2D_Disk2D(this);
                    }
                    else {
                      local_a8._M_dataplus._M_p = (pointer)paVar2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_a8,"Polyline2D","");
                      (*(((this->mReader)._M_t.
                          super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                          .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                        super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xd])();
                      iVar9 = std::__cxx11::string::compare((char *)&local_a8);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_a8._M_dataplus._M_p != paVar2) {
                        operator_delete(local_a8._M_dataplus._M_p,
                                        local_a8.field_2._M_allocated_capacity + 1);
                      }
                      if (iVar9 == 0) {
                        ParseNode_Geometry2D_Polyline2D(this);
                      }
                      else {
                        local_a8._M_dataplus._M_p = (pointer)paVar2;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_a8,"Polypoint2D","");
                        (*(((this->mReader)._M_t.
                            super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                            .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                          super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xd])();
                        iVar9 = std::__cxx11::string::compare((char *)&local_a8);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_a8._M_dataplus._M_p != paVar2) {
                          operator_delete(local_a8._M_dataplus._M_p,
                                          local_a8.field_2._M_allocated_capacity + 1);
                        }
                        if (iVar9 == 0) {
                          ParseNode_Geometry2D_Polypoint2D(this);
                        }
                        else {
                          local_a8._M_dataplus._M_p = (pointer)paVar2;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&local_a8,"Rectangle2D","");
                          (*(((this->mReader)._M_t.
                              super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                              .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                            super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xd])
                                    ();
                          iVar9 = std::__cxx11::string::compare((char *)&local_a8);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_a8._M_dataplus._M_p != paVar2) {
                            operator_delete(local_a8._M_dataplus._M_p,
                                            local_a8.field_2._M_allocated_capacity + 1);
                          }
                          if (iVar9 == 0) {
                            ParseNode_Geometry2D_Rectangle2D(this);
                          }
                          else {
                            local_a8._M_dataplus._M_p = (pointer)paVar2;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)&local_a8,"TriangleSet2D","");
                            (*(((this->mReader)._M_t.
                                super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                                .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                              super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xd]
                            )();
                            iVar9 = std::__cxx11::string::compare((char *)&local_a8);
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_a8._M_dataplus._M_p != paVar2) {
                              operator_delete(local_a8._M_dataplus._M_p,
                                              local_a8.field_2._M_allocated_capacity + 1);
                            }
                            if (iVar9 == 0) {
                              ParseNode_Geometry2D_TriangleSet2D(this);
                            }
                            else {
                              local_a8._M_dataplus._M_p = (pointer)paVar2;
                              std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)&local_a8,"Box","");
                              (*(((this->mReader)._M_t.
                                  super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                                  .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                                super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader
                                [0xd])();
                              iVar9 = std::__cxx11::string::compare((char *)&local_a8);
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_a8._M_dataplus._M_p != paVar2) {
                                operator_delete(local_a8._M_dataplus._M_p,
                                                local_a8.field_2._M_allocated_capacity + 1);
                              }
                              if (iVar9 == 0) {
                                ParseNode_Geometry3D_Box(this);
                              }
                              else {
                                local_a8._M_dataplus._M_p = (pointer)paVar2;
                                std::__cxx11::string::_M_construct<char_const*>
                                          ((string *)&local_a8,"Cone","");
                                (*(((this->mReader)._M_t.
                                    super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                                    .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)
                                  ->super_IIrrXMLReader<char,_irr::io::IXMLBase>).
                                  _vptr_IIrrXMLReader[0xd])();
                                iVar9 = std::__cxx11::string::compare((char *)&local_a8);
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_a8._M_dataplus._M_p != paVar2) {
                                  operator_delete(local_a8._M_dataplus._M_p,
                                                  local_a8.field_2._M_allocated_capacity + 1);
                                }
                                if (iVar9 == 0) {
                                  ParseNode_Geometry3D_Cone(this);
                                }
                                else {
                                  local_a8._M_dataplus._M_p = (pointer)paVar2;
                                  std::__cxx11::string::_M_construct<char_const*>
                                            ((string *)&local_a8,"Cylinder","");
                                  (*(((this->mReader)._M_t.
                                      super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                                      .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl
                                     )->super_IIrrXMLReader<char,_irr::io::IXMLBase>).
                                    _vptr_IIrrXMLReader[0xd])();
                                  iVar9 = std::__cxx11::string::compare((char *)&local_a8);
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_a8._M_dataplus._M_p != paVar2) {
                                    operator_delete(local_a8._M_dataplus._M_p,
                                                    local_a8.field_2._M_allocated_capacity + 1);
                                  }
                                  if (iVar9 == 0) {
                                    ParseNode_Geometry3D_Cylinder(this);
                                  }
                                  else {
                                    local_a8._M_dataplus._M_p = (pointer)paVar2;
                                    std::__cxx11::string::_M_construct<char_const*>
                                              ((string *)&local_a8,"ElevationGrid","");
                                    (*(((this->mReader)._M_t.
                                        super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                                        .super__Head_base<0UL,_Assimp::FIReader_*,_false>.
                                       _M_head_impl)->super_IIrrXMLReader<char,_irr::io::IXMLBase>).
                                      _vptr_IIrrXMLReader[0xd])();
                                    iVar9 = std::__cxx11::string::compare((char *)&local_a8);
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)local_a8._M_dataplus._M_p != paVar2) {
                                      operator_delete(local_a8._M_dataplus._M_p,
                                                      local_a8.field_2._M_allocated_capacity + 1);
                                    }
                                    if (iVar9 == 0) {
                                      ParseNode_Geometry3D_ElevationGrid(this);
                                    }
                                    else {
                                      local_a8._M_dataplus._M_p = (pointer)paVar2;
                                      std::__cxx11::string::_M_construct<char_const*>
                                                ((string *)&local_a8,"Extrusion","");
                                      (*(((this->mReader)._M_t.
                                          super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                                          .super__Head_base<0UL,_Assimp::FIReader_*,_false>.
                                         _M_head_impl)->super_IIrrXMLReader<char,_irr::io::IXMLBase>
                                        )._vptr_IIrrXMLReader[0xd])();
                                      iVar9 = std::__cxx11::string::compare((char *)&local_a8);
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)local_a8._M_dataplus._M_p != paVar2) {
                                        operator_delete(local_a8._M_dataplus._M_p,
                                                        local_a8.field_2._M_allocated_capacity + 1);
                                      }
                                      if (iVar9 == 0) {
                                        ParseNode_Geometry3D_Extrusion(this);
                                      }
                                      else {
                                        local_a8._M_dataplus._M_p = (pointer)paVar2;
                                        std::__cxx11::string::_M_construct<char_const*>
                                                  ((string *)&local_a8,"IndexedFaceSet","");
                                        (*(((this->mReader)._M_t.
                                            super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                                            .super__Head_base<0UL,_Assimp::FIReader_*,_false>.
                                           _M_head_impl)->
                                          super_IIrrXMLReader<char,_irr::io::IXMLBase>).
                                          _vptr_IIrrXMLReader[0xd])();
                                        iVar9 = std::__cxx11::string::compare((char *)&local_a8);
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_a8._M_dataplus._M_p != paVar2) {
                                          operator_delete(local_a8._M_dataplus._M_p,
                                                          local_a8.field_2._M_allocated_capacity + 1
                                                         );
                                        }
                                        if (iVar9 == 0) {
                                          ParseNode_Geometry3D_IndexedFaceSet(this);
                                        }
                                        else {
                                          local_a8._M_dataplus._M_p = (pointer)paVar2;
                                          std::__cxx11::string::_M_construct<char_const*>
                                                    ((string *)&local_a8,"Sphere","");
                                          (*(((this->mReader)._M_t.
                                              super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                                              .super__Head_base<0UL,_Assimp::FIReader_*,_false>.
                                             _M_head_impl)->
                                            super_IIrrXMLReader<char,_irr::io::IXMLBase>).
                                            _vptr_IIrrXMLReader[0xd])();
                                          iVar9 = std::__cxx11::string::compare((char *)&local_a8);
                                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                               *)local_a8._M_dataplus._M_p != paVar2) {
                                            operator_delete(local_a8._M_dataplus._M_p,
                                                            local_a8.field_2._M_allocated_capacity +
                                                            1);
                                          }
                                          if (iVar9 == 0) {
                                            ParseNode_Geometry3D_Sphere(this);
                                          }
                                          else {
                                            local_a8._M_dataplus._M_p = (pointer)paVar2;
                                            std::__cxx11::string::_M_construct<char_const*>
                                                      ((string *)&local_a8,"IndexedLineSet","");
                                            (*(((this->mReader)._M_t.
                                                super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                                                .super__Head_base<0UL,_Assimp::FIReader_*,_false>.
                                               _M_head_impl)->
                                              super_IIrrXMLReader<char,_irr::io::IXMLBase>).
                                              _vptr_IIrrXMLReader[0xd])();
                                            iVar9 = std::__cxx11::string::compare((char *)&local_a8)
                                            ;
                                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                 *)local_a8._M_dataplus._M_p != paVar2) {
                                              operator_delete(local_a8._M_dataplus._M_p,
                                                              local_a8.field_2._M_allocated_capacity
                                                              + 1);
                                            }
                                            if (iVar9 == 0) {
                                              ParseNode_Rendering_IndexedLineSet(this);
                                            }
                                            else {
                                              local_a8._M_dataplus._M_p = (pointer)paVar2;
                                              std::__cxx11::string::_M_construct<char_const*>
                                                        ((string *)&local_a8,"LineSet","");
                                              (*(((this->mReader)._M_t.
                                                  super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                                                  .super__Head_base<0UL,_Assimp::FIReader_*,_false>.
                                                 _M_head_impl)->
                                                super_IIrrXMLReader<char,_irr::io::IXMLBase>).
                                                _vptr_IIrrXMLReader[0xd])();
                                              iVar9 = std::__cxx11::string::compare
                                                                ((char *)&local_a8);
                                              if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_a8._M_dataplus._M_p != paVar2) {
                                                operator_delete(local_a8._M_dataplus._M_p,
                                                                local_a8.field_2.
                                                                _M_allocated_capacity + 1);
                                              }
                                              if (iVar9 == 0) {
                                                ParseNode_Rendering_LineSet(this);
                                              }
                                              else {
                                                local_a8._M_dataplus._M_p = (pointer)paVar2;
                                                std::__cxx11::string::_M_construct<char_const*>
                                                          ((string *)&local_a8,"PointSet","");
                                                (*(((this->mReader)._M_t.
                                                                                                        
                                                  super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                                                  .super__Head_base<0UL,_Assimp::FIReader_*,_false>.
                                                  _M_head_impl)->
                                                  super_IIrrXMLReader<char,_irr::io::IXMLBase>).
                                                  _vptr_IIrrXMLReader[0xd])();
                                                iVar9 = std::__cxx11::string::compare
                                                                  ((char *)&local_a8);
                                                if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_a8._M_dataplus._M_p != paVar2) {
                                                  operator_delete(local_a8._M_dataplus._M_p,
                                                                  local_a8.field_2.
                                                                  _M_allocated_capacity + 1);
                                                }
                                                if (iVar9 == 0) {
                                                  ParseNode_Rendering_PointSet(this);
                                                }
                                                else {
                                                  local_a8._M_dataplus._M_p = (pointer)paVar2;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)&local_a8,
                                                             "IndexedTriangleFanSet","");
                                                  (*(((this->mReader)._M_t.
                                                                                                            
                                                  super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                                                  .super__Head_base<0UL,_Assimp::FIReader_*,_false>.
                                                  _M_head_impl)->
                                                  super_IIrrXMLReader<char,_irr::io::IXMLBase>).
                                                  _vptr_IIrrXMLReader[0xd])();
                                                  iVar9 = std::__cxx11::string::compare
                                                                    ((char *)&local_a8);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_a8._M_dataplus._M_p != paVar2) {
                                                    operator_delete(local_a8._M_dataplus._M_p,
                                                                    local_a8.field_2.
                                                                    _M_allocated_capacity + 1);
                                                  }
                                                  if (iVar9 == 0) {
                                                    ParseNode_Rendering_IndexedTriangleFanSet(this);
                                                  }
                                                  else {
                                                    local_a8._M_dataplus._M_p = (pointer)paVar2;
                                                    std::__cxx11::string::_M_construct<char_const*>
                                                              ((string *)&local_a8,
                                                               "IndexedTriangleSet","");
                                                    (*(((this->mReader)._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                                                  .super__Head_base<0UL,_Assimp::FIReader_*,_false>.
                                                  _M_head_impl)->
                                                  super_IIrrXMLReader<char,_irr::io::IXMLBase>).
                                                  _vptr_IIrrXMLReader[0xd])();
                                                  iVar9 = std::__cxx11::string::compare
                                                                    ((char *)&local_a8);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_a8._M_dataplus._M_p != paVar2) {
                                                    operator_delete(local_a8._M_dataplus._M_p,
                                                                    local_a8.field_2.
                                                                    _M_allocated_capacity + 1);
                                                  }
                                                  if (iVar9 == 0) {
                                                    ParseNode_Rendering_IndexedTriangleSet(this);
                                                  }
                                                  else {
                                                    local_a8._M_dataplus._M_p = (pointer)paVar2;
                                                    std::__cxx11::string::_M_construct<char_const*>
                                                              ((string *)&local_a8,
                                                               "IndexedTriangleStripSet","");
                                                    (*(((this->mReader)._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                                                  .super__Head_base<0UL,_Assimp::FIReader_*,_false>.
                                                  _M_head_impl)->
                                                  super_IIrrXMLReader<char,_irr::io::IXMLBase>).
                                                  _vptr_IIrrXMLReader[0xd])();
                                                  iVar9 = std::__cxx11::string::compare
                                                                    ((char *)&local_a8);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_a8._M_dataplus._M_p != paVar2) {
                                                    operator_delete(local_a8._M_dataplus._M_p,
                                                                    local_a8.field_2.
                                                                    _M_allocated_capacity + 1);
                                                  }
                                                  this = local_88;
                                                  if (iVar9 == 0) {
                                                    ParseNode_Rendering_IndexedTriangleStripSet
                                                              (local_88);
                                                  }
                                                  else {
                                                    local_a8._M_dataplus._M_p = (pointer)paVar2;
                                                    std::__cxx11::string::_M_construct<char_const*>
                                                              ((string *)&local_a8,"TriangleFanSet",
                                                               "");
                                                    (*(((local_88->mReader)._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                                                  .super__Head_base<0UL,_Assimp::FIReader_*,_false>.
                                                  _M_head_impl)->
                                                  super_IIrrXMLReader<char,_irr::io::IXMLBase>).
                                                  _vptr_IIrrXMLReader[0xd])();
                                                  iVar9 = std::__cxx11::string::compare
                                                                    ((char *)&local_a8);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_a8._M_dataplus._M_p != paVar2) {
                                                    operator_delete(local_a8._M_dataplus._M_p,
                                                                    local_a8.field_2.
                                                                    _M_allocated_capacity + 1);
                                                  }
                                                  this = local_88;
                                                  if (iVar9 == 0) {
                                                    ParseNode_Rendering_TriangleFanSet(local_88);
                                                  }
                                                  else {
                                                    local_a8._M_dataplus._M_p = (pointer)paVar2;
                                                    std::__cxx11::string::_M_construct<char_const*>
                                                              ((string *)&local_a8,"TriangleSet","")
                                                    ;
                                                    (*(((local_88->mReader)._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                                                  .super__Head_base<0UL,_Assimp::FIReader_*,_false>.
                                                  _M_head_impl)->
                                                  super_IIrrXMLReader<char,_irr::io::IXMLBase>).
                                                  _vptr_IIrrXMLReader[0xd])();
                                                  iVar9 = std::__cxx11::string::compare
                                                                    ((char *)&local_a8);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_a8._M_dataplus._M_p != paVar2) {
                                                    operator_delete(local_a8._M_dataplus._M_p,
                                                                    local_a8.field_2.
                                                                    _M_allocated_capacity + 1);
                                                  }
                                                  this = local_88;
                                                  if (iVar9 == 0) {
                                                    ParseNode_Rendering_TriangleSet(local_88);
                                                  }
                                                  else {
                                                    local_a8._M_dataplus._M_p = (pointer)paVar2;
                                                    std::__cxx11::string::_M_construct<char_const*>
                                                              ((string *)&local_a8,
                                                               "TriangleStripSet","");
                                                    (*(((local_88->mReader)._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                                                  .super__Head_base<0UL,_Assimp::FIReader_*,_false>.
                                                  _M_head_impl)->
                                                  super_IIrrXMLReader<char,_irr::io::IXMLBase>).
                                                  _vptr_IIrrXMLReader[0xd])();
                                                  iVar9 = std::__cxx11::string::compare
                                                                    ((char *)&local_a8);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_a8._M_dataplus._M_p != paVar2) {
                                                    operator_delete(local_a8._M_dataplus._M_p,
                                                                    local_a8.field_2.
                                                                    _M_allocated_capacity + 1);
                                                  }
                                                  this = local_88;
                                                  if (iVar9 == 0) {
                                                    ParseNode_Rendering_TriangleStripSet(local_88);
                                                  }
                                                  else {
                                                    bVar7 = ParseHelper_CheckRead_X3DMetadataObject
                                                                      (local_88);
                                                    if (!bVar7) {
                                                      local_a8._M_dataplus._M_p = (pointer)paVar2;
                                                      std::__cxx11::string::
                                                      _M_construct<char_const*>
                                                                ((string *)&local_a8,"Shape","");
                                                      XML_CheckNode_SkipUnsupported
                                                                (local_88,&local_a8);
                                                      this = local_88;
                                                      if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_a8._M_dataplus._M_p != paVar2) {
                                                    operator_delete(local_a8._M_dataplus._M_p,
                                                                    local_a8.field_2.
                                                                    _M_allocated_capacity + 1);
                                                    this = local_88;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          iVar10 = (*(((this->mReader)._M_t.
                       super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                       .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                     super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[3])();
        } while (iVar10 != 2);
        local_a8._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"Shape","");
        (*(((this->mReader)._M_t.
            super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
            super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
            super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
          super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xd])();
        iVar10 = std::__cxx11::string::compare((char *)&local_a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != paVar2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        this = local_88;
      } while (iVar10 != 0);
      if ((char)iVar9 == '\0') {
LAB_0064e23c:
        local_a8._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"Shape","");
        Throw_CloseNotFound(this,&local_a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != paVar2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
      }
      ParseHelper_Node_Exit(this);
    }
    else {
      pCVar5 = this->NodeElement_Cur;
      p_Var11 = (_List_node_base *)operator_new(0x18);
      p_Var11[1]._M_next = (_List_node_base *)local_78;
      std::__detail::_List_node_base::_M_hook(p_Var11);
      psVar1 = &(pCVar5->Child).
                super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
    }
    p_Var11 = (_List_node_base *)operator_new(0x18);
    p_Var11[1]._M_next = (_List_node_base *)local_78;
    std::__detail::_List_node_base::_M_hook(p_Var11);
    plVar6 = &this->NodeElement_List;
  }
  else {
    XML_CheckNode_MustBeEmpty(this);
    if (local_70._M_string_length != 0) {
      Throw_DEF_And_USE(this);
    }
    bVar7 = FindNodeElement(this,&local_50,ENET_Shape,&local_78);
    if (!bVar7) {
      Throw_USE_NotFound(this,&local_50);
    }
    pCVar5 = this->NodeElement_Cur;
    p_Var11 = (_List_node_base *)operator_new(0x18);
    p_Var11[1]._M_next = (_List_node_base *)local_78;
    std::__detail::_List_node_base::_M_hook(p_Var11);
    plVar6 = &pCVar5->Child;
  }
  psVar1 = &(plVar6->
            super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
            )._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void X3DImporter::ParseNode_Shape_Shape()
{
    std::string use, def;
    CX3DImporter_NodeElement* ne( nullptr );

	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECKUSEDEF_RET(def, use);
	MACRO_ATTRREAD_LOOPEND;

	// if "USE" defined then find already defined element.
	if(!use.empty())
	{
		MACRO_USE_CHECKANDAPPLY(def, use, ENET_Shape, ne);
	}
	else
	{
		// create and if needed - define new geometry object.
		ne = new CX3DImporter_NodeElement_Shape(NodeElement_Cur);
		if(!def.empty()) ne->ID = def;

        // check for child nodes
        if(!mReader->isEmptyElement())
        {
			ParseHelper_Node_Enter(ne);
			MACRO_NODECHECK_LOOPBEGIN("Shape");
				// check for appearance node
				if(XML_CheckNode_NameEqual("Appearance")) { ParseNode_Shape_Appearance(); continue; }
				// check for X3DGeometryNodes
				if(XML_CheckNode_NameEqual("Arc2D")) { ParseNode_Geometry2D_Arc2D(); continue; }
				if(XML_CheckNode_NameEqual("ArcClose2D")) { ParseNode_Geometry2D_ArcClose2D(); continue; }
				if(XML_CheckNode_NameEqual("Circle2D")) { ParseNode_Geometry2D_Circle2D(); continue; }
				if(XML_CheckNode_NameEqual("Disk2D")) { ParseNode_Geometry2D_Disk2D(); continue; }
				if(XML_CheckNode_NameEqual("Polyline2D")) { ParseNode_Geometry2D_Polyline2D(); continue; }
				if(XML_CheckNode_NameEqual("Polypoint2D")) { ParseNode_Geometry2D_Polypoint2D(); continue; }
				if(XML_CheckNode_NameEqual("Rectangle2D")) { ParseNode_Geometry2D_Rectangle2D(); continue; }
				if(XML_CheckNode_NameEqual("TriangleSet2D")) { ParseNode_Geometry2D_TriangleSet2D(); continue; }
				if(XML_CheckNode_NameEqual("Box")) { ParseNode_Geometry3D_Box(); continue; }
				if(XML_CheckNode_NameEqual("Cone")) { ParseNode_Geometry3D_Cone(); continue; }
				if(XML_CheckNode_NameEqual("Cylinder")) { ParseNode_Geometry3D_Cylinder(); continue; }
				if(XML_CheckNode_NameEqual("ElevationGrid")) { ParseNode_Geometry3D_ElevationGrid(); continue; }
				if(XML_CheckNode_NameEqual("Extrusion")) { ParseNode_Geometry3D_Extrusion(); continue; }
				if(XML_CheckNode_NameEqual("IndexedFaceSet")) { ParseNode_Geometry3D_IndexedFaceSet(); continue; }
				if(XML_CheckNode_NameEqual("Sphere")) { ParseNode_Geometry3D_Sphere(); continue; }
				if(XML_CheckNode_NameEqual("IndexedLineSet")) { ParseNode_Rendering_IndexedLineSet(); continue; }
				if(XML_CheckNode_NameEqual("LineSet")) { ParseNode_Rendering_LineSet(); continue; }
				if(XML_CheckNode_NameEqual("PointSet")) { ParseNode_Rendering_PointSet(); continue; }
				if(XML_CheckNode_NameEqual("IndexedTriangleFanSet")) { ParseNode_Rendering_IndexedTriangleFanSet(); continue; }
				if(XML_CheckNode_NameEqual("IndexedTriangleSet")) { ParseNode_Rendering_IndexedTriangleSet(); continue; }
				if(XML_CheckNode_NameEqual("IndexedTriangleStripSet")) { ParseNode_Rendering_IndexedTriangleStripSet(); continue; }
				if(XML_CheckNode_NameEqual("TriangleFanSet")) { ParseNode_Rendering_TriangleFanSet(); continue; }
				if(XML_CheckNode_NameEqual("TriangleSet")) { ParseNode_Rendering_TriangleSet(); continue; }
				if(XML_CheckNode_NameEqual("TriangleStripSet")) { ParseNode_Rendering_TriangleStripSet(); continue; }
				// check for X3DMetadataObject
				if(!ParseHelper_CheckRead_X3DMetadataObject()) XML_CheckNode_SkipUnsupported("Shape");

			MACRO_NODECHECK_LOOPEND("Shape");
			ParseHelper_Node_Exit();
		}// if(!mReader->isEmptyElement())
		else
		{
			NodeElement_Cur->Child.push_back(ne);// add made object as child to current element
		}

		NodeElement_List.push_back(ne);// add element to node element list because its a new object in graph
	}// if(!use.empty()) else
}